

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_1048576,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  undefined8 *puVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  Scene *pSVar5;
  float **ppfVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  Geometry *pGVar11;
  RTCIntersectArguments *pRVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  bool bVar21;
  undefined1 auVar22 [16];
  undefined4 uVar23;
  ulong uVar24;
  long lVar25;
  undefined4 uVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong uVar29;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  size_t sVar34;
  ulong uVar35;
  int iVar36;
  bool bVar37;
  float fVar47;
  float fVar48;
  vint4 ai_1;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  float fVar49;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  vint4 ai;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  float fVar87;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar98;
  float fVar100;
  float fVar101;
  float fVar103;
  vint4 bi;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar99;
  float fVar102;
  float fVar104;
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar105;
  float fVar106;
  float fVar107;
  float fVar116;
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  float fVar119;
  undefined1 auVar112 [16];
  float fVar118;
  float fVar120;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  float fVar133;
  float fVar134;
  float fVar139;
  float fVar141;
  undefined1 auVar135 [16];
  float fVar143;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar140;
  float fVar142;
  float fVar144;
  undefined1 auVar138 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar152 [16];
  float fVar153;
  float fVar155;
  float fVar156;
  undefined1 auVar154 [16];
  float fVar157;
  float fVar158;
  float fVar161;
  float fVar162;
  undefined1 auVar159 [16];
  float fVar163;
  undefined1 auVar160 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_abc;
  undefined1 local_ab8 [16];
  undefined8 local_aa8;
  float fStack_aa0;
  float fStack_a9c;
  ulong local_a98;
  NodeRef *local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  ulong local_a70;
  undefined1 local_a68 [16];
  ulong local_a58;
  ulong local_a50;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  UVIdentity<4> *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar22 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar89 = ray->tfar;
    if (0.0 <= fVar89) {
      local_a90 = stack + 1;
      aVar4 = (ray->dir).field_0;
      auVar19 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar91._8_4_ = 0x7fffffff;
      auVar91._0_8_ = 0x7fffffff7fffffff;
      auVar91._12_4_ = 0x7fffffff;
      auVar91 = vandps_avx((undefined1  [16])aVar4,auVar91);
      auVar39._8_4_ = 0x219392ef;
      auVar39._0_8_ = 0x219392ef219392ef;
      auVar39._12_4_ = 0x219392ef;
      auVar91 = vcmpps_avx(auVar91,auVar39,1);
      auVar91 = vblendvps_avx((undefined1  [16])aVar4,auVar39,auVar91);
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar39 = vrcpps_avx(auVar91);
      fVar99 = auVar39._0_4_;
      auVar73._0_4_ = fVar99 * auVar91._0_4_;
      fVar98 = auVar39._4_4_;
      auVar73._4_4_ = fVar98 * auVar91._4_4_;
      fVar101 = auVar39._8_4_;
      auVar73._8_4_ = fVar101 * auVar91._8_4_;
      fVar72 = auVar39._12_4_;
      auVar73._12_4_ = fVar72 * auVar91._12_4_;
      auVar108._8_4_ = 0x3f800000;
      auVar108._0_8_ = &DAT_3f8000003f800000;
      auVar108._12_4_ = 0x3f800000;
      auVar91 = vsubps_avx(auVar108,auVar73);
      auVar74._0_4_ = fVar99 + fVar99 * auVar91._0_4_;
      auVar74._4_4_ = fVar98 + fVar98 * auVar91._4_4_;
      auVar74._8_4_ = fVar101 + fVar101 * auVar91._8_4_;
      auVar74._12_4_ = fVar72 + fVar72 * auVar91._12_4_;
      uVar2 = *(undefined4 *)&(ray->org).field_0;
      local_a68._4_4_ = uVar2;
      local_a68._0_4_ = uVar2;
      local_a68._8_4_ = uVar2;
      local_a68._12_4_ = uVar2;
      auVar132 = ZEXT1664(local_a68);
      uVar2 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar3 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar73 = vshufps_avx(auVar74,auVar74,0);
      auVar91 = vmovshdup_avx(auVar74);
      auVar108 = vshufps_avx(auVar74,auVar74,0x55);
      auVar39 = vshufpd_avx(auVar74,auVar74,1);
      auVar20 = vshufps_avx(auVar74,auVar74,0xaa);
      local_a98 = (ulong)(auVar74._0_4_ < 0.0) << 2;
      uVar30 = local_a98 ^ 4;
      uVar31 = (ulong)((uint)(auVar91._0_4_ < 0.0) * 4 + 8);
      uVar29 = uVar31 ^ 4;
      local_a88 = (ulong)((uint)(auVar39._0_4_ < 0.0) * 4 + 0x10);
      uVar32 = local_a88 ^ 4;
      auVar91 = vshufps_avx(auVar19,auVar19,0);
      auVar19 = vshufps_avx(ZEXT416((uint)fVar89),ZEXT416((uint)fVar89),0);
      uVar35 = local_a88;
      local_a80 = uVar29;
      local_a78 = uVar31;
      local_a70 = uVar30;
      do {
        if (local_a90 == stack) {
          return;
        }
        sVar34 = local_a90[-1].ptr;
        local_a90 = local_a90 + -1;
        do {
          if ((sVar34 & 8) == 0) {
            puVar27 = (ulong *)((sVar34 & 0xfffffffffffffff0) + 0x20);
            if ((sVar34 & 0xfffffffffffffff0) == 0) {
              puVar27 = (ulong *)0x0;
            }
            auVar38._8_8_ = 0;
            auVar38._0_8_ = *puVar27;
            auVar50._8_8_ = 0;
            auVar50._0_8_ = *(ulong *)((long)puVar27 + 4);
            auVar74 = vpminub_avx(auVar38,auVar50);
            auVar39 = vpcmpeqb_avx(auVar38,auVar74);
            auVar74 = vpcmpeqd_avx(auVar74,auVar74);
            auVar39 = vpmovzxbd_avx(auVar39 ^ auVar74);
            auVar39 = vpslld_avx(auVar39 ^ auVar74,0x1f);
            uVar23 = vmovmskps_avx(auVar39);
            fVar89 = *(float *)(puVar27 + 3);
            fVar99 = *(float *)((long)puVar27 + 0x24);
            auVar60._8_8_ = 0;
            auVar60._0_8_ = *(ulong *)((long)puVar27 + local_a98);
            auVar39 = vpmovzxbd_avx(auVar60);
            auVar39 = vcvtdq2ps_avx(auVar39);
            auVar61._0_4_ = fVar89 + fVar99 * auVar39._0_4_;
            auVar61._4_4_ = fVar89 + fVar99 * auVar39._4_4_;
            auVar61._8_4_ = fVar89 + fVar99 * auVar39._8_4_;
            auVar61._12_4_ = fVar89 + fVar99 * auVar39._12_4_;
            auVar75._8_8_ = 0;
            auVar75._0_8_ = *(ulong *)((long)puVar27 + uVar30);
            auVar39 = vpmovzxbd_avx(auVar75);
            auVar39 = vcvtdq2ps_avx(auVar39);
            auVar40._0_4_ = fVar89 + fVar99 * auVar39._0_4_;
            auVar40._4_4_ = fVar89 + fVar99 * auVar39._4_4_;
            auVar40._8_4_ = fVar89 + fVar99 * auVar39._8_4_;
            auVar40._12_4_ = fVar89 + fVar99 * auVar39._12_4_;
            fVar89 = *(float *)((long)puVar27 + 0x1c);
            fVar99 = *(float *)(puVar27 + 5);
            auVar92._8_8_ = 0;
            auVar92._0_8_ = *(ulong *)((long)puVar27 + uVar31);
            auVar39 = vpmovzxbd_avx(auVar92);
            auVar39 = vcvtdq2ps_avx(auVar39);
            auVar93._0_4_ = fVar89 + fVar99 * auVar39._0_4_;
            auVar93._4_4_ = fVar89 + fVar99 * auVar39._4_4_;
            auVar93._8_4_ = fVar89 + fVar99 * auVar39._8_4_;
            auVar93._12_4_ = fVar89 + fVar99 * auVar39._12_4_;
            auVar109._8_8_ = 0;
            auVar109._0_8_ = *(ulong *)((long)puVar27 + uVar29);
            auVar39 = vpmovzxbd_avx(auVar109);
            auVar39 = vcvtdq2ps_avx(auVar39);
            auVar51._0_4_ = fVar89 + fVar99 * auVar39._0_4_;
            auVar51._4_4_ = fVar89 + fVar99 * auVar39._4_4_;
            auVar51._8_4_ = fVar89 + fVar99 * auVar39._8_4_;
            auVar51._12_4_ = fVar89 + fVar99 * auVar39._12_4_;
            fVar89 = *(float *)((long)puVar27 + 0x2c);
            auVar110._8_8_ = 0;
            auVar110._0_8_ = *(ulong *)((long)puVar27 + uVar35);
            auVar39 = vpmovzxbd_avx(auVar110);
            auVar39 = vcvtdq2ps_avx(auVar39);
            auVar121._8_8_ = 0;
            auVar121._0_8_ = *(ulong *)((long)puVar27 + uVar32);
            auVar74 = vpmovzxbd_avx(auVar121);
            auVar74 = vcvtdq2ps_avx(auVar74);
            fVar99 = *(float *)(puVar27 + 4);
            auVar111._0_4_ = fVar99 + fVar89 * auVar39._0_4_;
            auVar111._4_4_ = fVar99 + fVar89 * auVar39._4_4_;
            auVar111._8_4_ = fVar99 + fVar89 * auVar39._8_4_;
            auVar111._12_4_ = fVar99 + fVar89 * auVar39._12_4_;
            auVar76._0_4_ = fVar99 + fVar89 * auVar74._0_4_;
            auVar76._4_4_ = fVar99 + fVar89 * auVar74._4_4_;
            auVar76._8_4_ = fVar99 + fVar89 * auVar74._8_4_;
            auVar76._12_4_ = fVar99 + fVar89 * auVar74._12_4_;
            auVar39 = vsubps_avx(auVar61,auVar132._0_16_);
            auVar62._0_4_ = auVar73._0_4_ * auVar39._0_4_;
            auVar62._4_4_ = auVar73._4_4_ * auVar39._4_4_;
            auVar62._8_4_ = auVar73._8_4_ * auVar39._8_4_;
            auVar62._12_4_ = auVar73._12_4_ * auVar39._12_4_;
            auVar126._4_4_ = uVar2;
            auVar126._0_4_ = uVar2;
            auVar126._8_4_ = uVar2;
            auVar126._12_4_ = uVar2;
            auVar39 = vsubps_avx(auVar93,auVar126);
            auVar94._0_4_ = auVar108._0_4_ * auVar39._0_4_;
            auVar94._4_4_ = auVar108._4_4_ * auVar39._4_4_;
            auVar94._8_4_ = auVar108._8_4_ * auVar39._8_4_;
            auVar94._12_4_ = auVar108._12_4_ * auVar39._12_4_;
            auVar39 = vpmaxsd_avx(auVar62,auVar94);
            auVar125._4_4_ = uVar3;
            auVar125._0_4_ = uVar3;
            auVar125._8_4_ = uVar3;
            auVar125._12_4_ = uVar3;
            auVar74 = vsubps_avx(auVar111,auVar125);
            auVar95._0_4_ = auVar20._0_4_ * auVar74._0_4_;
            auVar95._4_4_ = auVar20._4_4_ * auVar74._4_4_;
            auVar95._8_4_ = auVar20._8_4_ * auVar74._8_4_;
            auVar95._12_4_ = auVar20._12_4_ * auVar74._12_4_;
            auVar74 = vpmaxsd_avx(auVar95,auVar91);
            auVar39 = vpmaxsd_avx(auVar39,auVar74);
            auVar74 = vsubps_avx(auVar40,auVar132._0_16_);
            auVar41._0_4_ = auVar73._0_4_ * auVar74._0_4_;
            auVar41._4_4_ = auVar73._4_4_ * auVar74._4_4_;
            auVar41._8_4_ = auVar73._8_4_ * auVar74._8_4_;
            auVar41._12_4_ = auVar73._12_4_ * auVar74._12_4_;
            auVar74 = vsubps_avx(auVar51,auVar126);
            auVar52._0_4_ = auVar108._0_4_ * auVar74._0_4_;
            auVar52._4_4_ = auVar108._4_4_ * auVar74._4_4_;
            auVar52._8_4_ = auVar108._8_4_ * auVar74._8_4_;
            auVar52._12_4_ = auVar108._12_4_ * auVar74._12_4_;
            auVar74 = vpminsd_avx(auVar41,auVar52);
            auVar125 = vsubps_avx(auVar76,auVar125);
            auVar53._0_4_ = auVar20._0_4_ * auVar125._0_4_;
            auVar53._4_4_ = auVar20._4_4_ * auVar125._4_4_;
            auVar53._8_4_ = auVar20._8_4_ * auVar125._8_4_;
            auVar53._12_4_ = auVar20._12_4_ * auVar125._12_4_;
            auVar125 = vpminsd_avx(auVar53,auVar19);
            auVar74 = vpminsd_avx(auVar74,auVar125);
            auVar39 = vpcmpgtd_avx(auVar39,auVar74);
            uVar26 = vmovmskps_avx(auVar39);
            unaff_RBP = (ulong)(byte)(~(byte)uVar26 & (byte)uVar23);
          }
          if ((sVar34 & 8) == 0) {
            if (unaff_RBP == 0) {
              iVar36 = 4;
            }
            else {
              uVar33 = sVar34 & 0xfffffffffffffff0;
              lVar25 = 0;
              if (unaff_RBP != 0) {
                for (; (unaff_RBP >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                }
              }
              iVar36 = 0;
              sVar34 = *(size_t *)(uVar33 + lVar25 * 8);
              uVar28 = unaff_RBP - 1 & unaff_RBP;
              if (uVar28 != 0) {
                local_a90->ptr = sVar34;
                lVar25 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                  }
                }
                uVar24 = uVar28 - 1;
                while( true ) {
                  local_a90 = local_a90 + 1;
                  sVar34 = *(size_t *)(uVar33 + lVar25 * 8);
                  uVar24 = uVar24 & uVar28;
                  if (uVar24 == 0) break;
                  local_a90->ptr = sVar34;
                  lVar25 = 0;
                  if (uVar24 != 0) {
                    for (; (uVar24 >> lVar25 & 1) == 0; lVar25 = lVar25 + 1) {
                    }
                  }
                  uVar28 = uVar24 - 1;
                }
              }
            }
          }
          else {
            iVar36 = 6;
          }
        } while (iVar36 == 0);
        uVar33 = uVar35;
        if (iVar36 == 6) {
          iVar36 = 0;
          local_a58 = (ulong)((uint)sVar34 & 0xf) - 8;
          bVar37 = local_a58 != 0;
          if (bVar37) {
            uVar28 = sVar34 & 0xfffffffffffffff0;
            pSVar5 = context->scene;
            local_a50 = 0;
            do {
              lVar25 = local_a50 * 0x50;
              ppfVar6 = (pSVar5->vertices).items;
              pfVar7 = ppfVar6[*(uint *)(uVar28 + 0x30 + lVar25)];
              pfVar8 = ppfVar6[*(uint *)(uVar28 + 0x34 + lVar25)];
              pfVar9 = ppfVar6[*(uint *)(uVar28 + 0x38 + lVar25)];
              pfVar10 = ppfVar6[*(uint *)(uVar28 + 0x3c + lVar25)];
              auVar125 = vunpcklps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + lVar25)),
                                       *(undefined1 (*) [16])
                                        (pfVar9 + *(uint *)(uVar28 + 8 + lVar25)));
              auVar39 = vunpckhps_avx(*(undefined1 (*) [16])(pfVar7 + *(uint *)(uVar28 + lVar25)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar28 + 8 + lVar25)));
              auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar28 + 4 + lVar25)),
                                       *(undefined1 (*) [16])
                                        (pfVar10 + *(uint *)(uVar28 + 0xc + lVar25)));
              auVar74 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar28 + 4 + lVar25)),
                                      *(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar28 + 0xc + lVar25)));
              auVar40 = vunpcklps_avx(auVar39,auVar74);
              auVar41 = vunpcklps_avx(auVar125,auVar126);
              auVar74 = vunpckhps_avx(auVar125,auVar126);
              auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar28 + 0x10 + lVar25)),
                                       *(undefined1 (*) [16])
                                        (pfVar9 + *(uint *)(uVar28 + 0x18 + lVar25)));
              auVar39 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar28 + 0x10 + lVar25)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar28 + 0x18 + lVar25)));
              auVar38 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar28 + 0x14 + lVar25)),
                                      *(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar28 + 0x1c + lVar25)));
              auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar28 + 0x14 + lVar25)),
                                       *(undefined1 (*) [16])
                                        (pfVar10 + *(uint *)(uVar28 + 0x1c + lVar25)));
              auVar51 = vunpcklps_avx(auVar39,auVar125);
              auVar52 = vunpcklps_avx(auVar126,auVar38);
              auVar38 = vunpckhps_avx(auVar126,auVar38);
              auVar126 = vunpcklps_avx(*(undefined1 (*) [16])
                                        (pfVar7 + *(uint *)(uVar28 + 0x20 + lVar25)),
                                       *(undefined1 (*) [16])
                                        (pfVar9 + *(uint *)(uVar28 + 0x28 + lVar25)));
              auVar39 = vunpckhps_avx(*(undefined1 (*) [16])
                                       (pfVar7 + *(uint *)(uVar28 + 0x20 + lVar25)),
                                      *(undefined1 (*) [16])
                                       (pfVar9 + *(uint *)(uVar28 + 0x28 + lVar25)));
              auVar50 = vunpcklps_avx(*(undefined1 (*) [16])
                                       (pfVar8 + *(uint *)(uVar28 + 0x24 + lVar25)),
                                      *(undefined1 (*) [16])
                                       (pfVar10 + *(uint *)(uVar28 + 0x2c + lVar25)));
              auVar125 = vunpckhps_avx(*(undefined1 (*) [16])
                                        (pfVar8 + *(uint *)(uVar28 + 0x24 + lVar25)),
                                       *(undefined1 (*) [16])
                                        (pfVar10 + *(uint *)(uVar28 + 0x2c + lVar25)));
              auVar53 = vunpcklps_avx(auVar39,auVar125);
              auVar60 = vunpcklps_avx(auVar126,auVar50);
              auVar50 = vunpckhps_avx(auVar126,auVar50);
              puVar1 = (undefined8 *)(uVar28 + 0x30 + lVar25);
              local_898 = *puVar1;
              uStack_890 = puVar1[1];
              puVar1 = (undefined8 *)(uVar28 + 0x40 + lVar25);
              local_8a8 = *puVar1;
              uStack_8a0 = puVar1[1];
              uVar23 = *(undefined4 *)&(ray->org).field_0;
              auVar145._4_4_ = uVar23;
              auVar145._0_4_ = uVar23;
              auVar145._8_4_ = uVar23;
              auVar145._12_4_ = uVar23;
              uVar23 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar154._4_4_ = uVar23;
              auVar154._0_4_ = uVar23;
              auVar154._8_4_ = uVar23;
              auVar154._12_4_ = uVar23;
              uVar23 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar159._4_4_ = uVar23;
              auVar159._0_4_ = uVar23;
              auVar159._8_4_ = uVar23;
              auVar159._12_4_ = uVar23;
              auVar39 = vsubps_avx(auVar41,auVar145);
              auVar74 = vsubps_avx(auVar74,auVar154);
              auVar125 = vsubps_avx(auVar40,auVar159);
              auVar126 = vsubps_avx(auVar52,auVar145);
              auVar38 = vsubps_avx(auVar38,auVar154);
              auVar40 = vsubps_avx(auVar51,auVar159);
              auVar41 = vsubps_avx(auVar60,auVar145);
              auVar50 = vsubps_avx(auVar50,auVar154);
              auVar51 = vsubps_avx(auVar53,auVar159);
              auVar52 = vsubps_avx(auVar41,auVar39);
              auVar53 = vsubps_avx(auVar50,auVar74);
              auVar60 = vsubps_avx(auVar51,auVar125);
              fVar98 = auVar74._0_4_;
              fVar89 = auVar50._0_4_ + fVar98;
              fVar84 = auVar74._4_4_;
              fVar99 = auVar50._4_4_ + fVar84;
              fVar13 = auVar74._8_4_;
              fVar102 = auVar50._8_4_ + fVar13;
              fVar16 = auVar74._12_4_;
              fVar104 = auVar50._12_4_ + fVar16;
              fVar101 = auVar125._0_4_;
              fVar106 = auVar51._0_4_ + fVar101;
              fVar86 = auVar125._4_4_;
              fVar116 = auVar51._4_4_ + fVar86;
              fVar14 = auVar125._8_4_;
              fVar117 = auVar51._8_4_ + fVar14;
              fVar17 = auVar125._12_4_;
              fVar119 = auVar51._12_4_ + fVar17;
              fVar71 = auVar60._0_4_;
              auVar135._0_4_ = fVar71 * fVar89;
              fVar47 = auVar60._4_4_;
              auVar135._4_4_ = fVar47 * fVar99;
              fVar48 = auVar60._8_4_;
              auVar135._8_4_ = fVar48 * fVar102;
              fVar49 = auVar60._12_4_;
              auVar135._12_4_ = fVar49 * fVar104;
              fVar164 = auVar53._0_4_;
              auVar146._0_4_ = fVar164 * fVar106;
              fVar165 = auVar53._4_4_;
              auVar146._4_4_ = fVar165 * fVar116;
              fVar166 = auVar53._8_4_;
              auVar146._8_4_ = fVar166 * fVar117;
              fVar167 = auVar53._12_4_;
              auVar146._12_4_ = fVar167 * fVar119;
              auVar53 = vsubps_avx(auVar146,auVar135);
              fVar72 = auVar39._0_4_;
              fVar133 = auVar41._0_4_ + fVar72;
              fVar88 = auVar39._4_4_;
              fVar139 = auVar41._4_4_ + fVar88;
              fVar15 = auVar39._8_4_;
              fVar141 = auVar41._8_4_ + fVar15;
              fVar18 = auVar39._12_4_;
              fVar143 = auVar41._12_4_ + fVar18;
              fVar158 = auVar52._0_4_;
              auVar112._0_4_ = fVar158 * fVar106;
              fVar161 = auVar52._4_4_;
              auVar112._4_4_ = fVar161 * fVar116;
              fVar162 = auVar52._8_4_;
              auVar112._8_4_ = fVar162 * fVar117;
              fVar163 = auVar52._12_4_;
              auVar112._12_4_ = fVar163 * fVar119;
              auVar147._0_4_ = fVar133 * fVar71;
              auVar147._4_4_ = fVar139 * fVar47;
              auVar147._8_4_ = fVar141 * fVar48;
              auVar147._12_4_ = fVar143 * fVar49;
              auVar52 = vsubps_avx(auVar147,auVar112);
              auVar136._0_4_ = fVar164 * fVar133;
              auVar136._4_4_ = fVar165 * fVar139;
              auVar136._8_4_ = fVar166 * fVar141;
              auVar136._12_4_ = fVar167 * fVar143;
              auVar96._0_4_ = fVar158 * fVar89;
              auVar96._4_4_ = fVar161 * fVar99;
              auVar96._8_4_ = fVar162 * fVar102;
              auVar96._12_4_ = fVar163 * fVar104;
              auVar60 = vsubps_avx(auVar96,auVar136);
              fVar89 = (ray->dir).field_0.m128[2];
              local_aa8._4_4_ = (ray->dir).field_0.m128[1];
              fVar99 = (ray->dir).field_0.m128[0];
              local_ab8._0_4_ =
                   auVar53._0_4_ * fVar99 + local_aa8._4_4_ * auVar52._0_4_ + fVar89 * auVar60._0_4_
              ;
              local_ab8._4_4_ =
                   auVar53._4_4_ * fVar99 + local_aa8._4_4_ * auVar52._4_4_ + fVar89 * auVar60._4_4_
              ;
              local_ab8._8_4_ =
                   auVar53._8_4_ * fVar99 + local_aa8._4_4_ * auVar52._8_4_ + fVar89 * auVar60._8_4_
              ;
              local_ab8._12_4_ =
                   auVar53._12_4_ * fVar99 +
                   local_aa8._4_4_ * auVar52._12_4_ + fVar89 * auVar60._12_4_;
              auVar74 = vsubps_avx(auVar74,auVar38);
              auVar125 = vsubps_avx(auVar125,auVar40);
              fVar104 = fVar98 + auVar38._0_4_;
              fVar116 = fVar84 + auVar38._4_4_;
              fVar119 = fVar13 + auVar38._8_4_;
              fVar139 = fVar16 + auVar38._12_4_;
              fVar141 = auVar40._0_4_ + fVar101;
              fVar143 = auVar40._4_4_ + fVar86;
              fVar118 = auVar40._8_4_ + fVar14;
              fVar120 = auVar40._12_4_ + fVar17;
              fVar148 = auVar125._0_4_;
              auVar160._0_4_ = fVar148 * fVar104;
              fVar149 = auVar125._4_4_;
              auVar160._4_4_ = fVar149 * fVar116;
              fVar150 = auVar125._8_4_;
              auVar160._8_4_ = fVar150 * fVar119;
              fVar151 = auVar125._12_4_;
              auVar160._12_4_ = fVar151 * fVar139;
              fVar102 = auVar74._0_4_;
              auVar77._0_4_ = fVar102 * fVar141;
              fVar106 = auVar74._4_4_;
              auVar77._4_4_ = fVar106 * fVar143;
              fVar117 = auVar74._8_4_;
              auVar77._8_4_ = fVar117 * fVar118;
              fVar133 = auVar74._12_4_;
              auVar77._12_4_ = fVar133 * fVar120;
              auVar74 = vsubps_avx(auVar77,auVar160);
              auVar39 = vsubps_avx(auVar39,auVar126);
              fVar153 = auVar39._0_4_;
              auVar113._0_4_ = fVar153 * fVar141;
              fVar155 = auVar39._4_4_;
              auVar113._4_4_ = fVar155 * fVar143;
              fVar156 = auVar39._8_4_;
              auVar113._8_4_ = fVar156 * fVar118;
              fVar157 = auVar39._12_4_;
              auVar113._12_4_ = fVar157 * fVar120;
              fVar141 = auVar126._0_4_ + fVar72;
              fVar143 = auVar126._4_4_ + fVar88;
              fVar118 = auVar126._8_4_ + fVar15;
              fVar120 = auVar126._12_4_ + fVar18;
              auVar137._0_4_ = fVar148 * fVar141;
              auVar137._4_4_ = fVar149 * fVar143;
              auVar137._8_4_ = fVar150 * fVar118;
              auVar137._12_4_ = fVar151 * fVar120;
              auVar39 = vsubps_avx(auVar137,auVar113);
              auVar127._0_4_ = fVar102 * fVar141;
              auVar127._4_4_ = fVar106 * fVar143;
              auVar127._8_4_ = fVar117 * fVar118;
              auVar127._12_4_ = fVar133 * fVar120;
              auVar97._0_4_ = fVar153 * fVar104;
              auVar97._4_4_ = fVar155 * fVar116;
              auVar97._8_4_ = fVar156 * fVar119;
              auVar97._12_4_ = fVar157 * fVar139;
              auVar125 = vsubps_avx(auVar97,auVar127);
              local_878._0_4_ =
                   fVar99 * auVar74._0_4_ +
                   local_aa8._4_4_ * auVar39._0_4_ + fVar89 * auVar125._0_4_;
              local_878._4_4_ =
                   fVar99 * auVar74._4_4_ +
                   local_aa8._4_4_ * auVar39._4_4_ + fVar89 * auVar125._4_4_;
              local_878._8_4_ =
                   fVar99 * auVar74._8_4_ +
                   local_aa8._4_4_ * auVar39._8_4_ + fVar89 * auVar125._8_4_;
              local_878._12_4_ =
                   fVar99 * auVar74._12_4_ +
                   local_aa8._4_4_ * auVar39._12_4_ + fVar89 * auVar125._12_4_;
              auVar39 = vsubps_avx(auVar126,auVar41);
              fVar70 = auVar126._0_4_ + auVar41._0_4_;
              fVar83 = auVar126._4_4_ + auVar41._4_4_;
              fVar85 = auVar126._8_4_ + auVar41._8_4_;
              fVar87 = auVar126._12_4_ + auVar41._12_4_;
              auVar74 = vsubps_avx(auVar38,auVar50);
              fVar141 = auVar50._0_4_ + auVar38._0_4_;
              fVar143 = auVar50._4_4_ + auVar38._4_4_;
              fVar118 = auVar50._8_4_ + auVar38._8_4_;
              fVar120 = auVar50._12_4_ + auVar38._12_4_;
              auVar125 = vsubps_avx(auVar40,auVar51);
              fVar104 = auVar40._0_4_ + auVar51._0_4_;
              fVar116 = auVar40._4_4_ + auVar51._4_4_;
              fVar119 = auVar40._8_4_ + auVar51._8_4_;
              fVar139 = auVar40._12_4_ + auVar51._12_4_;
              fVar90 = auVar125._0_4_;
              auVar54._0_4_ = fVar90 * fVar141;
              fVar100 = auVar125._4_4_;
              auVar54._4_4_ = fVar100 * fVar143;
              fVar103 = auVar125._8_4_;
              auVar54._8_4_ = fVar103 * fVar118;
              fVar105 = auVar125._12_4_;
              auVar54._12_4_ = fVar105 * fVar120;
              fVar134 = auVar74._0_4_;
              auVar128._0_4_ = fVar134 * fVar104;
              fVar140 = auVar74._4_4_;
              auVar128._4_4_ = fVar140 * fVar116;
              fVar142 = auVar74._8_4_;
              auVar128._8_4_ = fVar142 * fVar119;
              fVar144 = auVar74._12_4_;
              auVar128._12_4_ = fVar144 * fVar139;
              auVar74 = vsubps_avx(auVar128,auVar54);
              fVar107 = auVar39._0_4_;
              auVar42._0_4_ = fVar107 * fVar104;
              fVar104 = auVar39._4_4_;
              auVar42._4_4_ = fVar104 * fVar116;
              fVar116 = auVar39._8_4_;
              auVar42._8_4_ = fVar116 * fVar119;
              fVar119 = auVar39._12_4_;
              auVar42._12_4_ = fVar119 * fVar139;
              auVar129._0_4_ = fVar90 * fVar70;
              auVar129._4_4_ = fVar100 * fVar83;
              auVar129._8_4_ = fVar103 * fVar85;
              auVar129._12_4_ = fVar105 * fVar87;
              auVar39 = vsubps_avx(auVar129,auVar42);
              auVar132 = ZEXT1664(local_a68);
              auVar78._0_4_ = fVar134 * fVar70;
              auVar78._4_4_ = fVar140 * fVar83;
              auVar78._8_4_ = fVar142 * fVar85;
              auVar78._12_4_ = fVar144 * fVar87;
              auVar63._0_4_ = fVar107 * fVar141;
              auVar63._4_4_ = fVar104 * fVar143;
              auVar63._8_4_ = fVar116 * fVar118;
              auVar63._12_4_ = fVar119 * fVar120;
              auVar125 = vsubps_avx(auVar63,auVar78);
              local_aa8._0_4_ = local_aa8._4_4_;
              fStack_aa0 = local_aa8._4_4_;
              fStack_a9c = local_aa8._4_4_;
              auVar43._0_4_ =
                   fVar99 * auVar74._0_4_ +
                   local_aa8._4_4_ * auVar39._0_4_ + fVar89 * auVar125._0_4_;
              auVar43._4_4_ =
                   fVar99 * auVar74._4_4_ +
                   local_aa8._4_4_ * auVar39._4_4_ + fVar89 * auVar125._4_4_;
              auVar43._8_4_ =
                   fVar99 * auVar74._8_4_ +
                   local_aa8._4_4_ * auVar39._8_4_ + fVar89 * auVar125._8_4_;
              auVar43._12_4_ =
                   fVar99 * auVar74._12_4_ +
                   local_aa8._4_4_ * auVar39._12_4_ + fVar89 * auVar125._12_4_;
              local_868._0_4_ = auVar43._0_4_ + local_ab8._0_4_ + local_878._0_4_;
              local_868._4_4_ = auVar43._4_4_ + local_ab8._4_4_ + local_878._4_4_;
              local_868._8_4_ = auVar43._8_4_ + local_ab8._8_4_ + local_878._8_4_;
              local_868._12_4_ = auVar43._12_4_ + local_ab8._12_4_ + local_878._12_4_;
              auVar39 = vminps_avx(local_ab8,local_878);
              auVar74 = vminps_avx(auVar39,auVar43);
              auVar64._8_4_ = 0x7fffffff;
              auVar64._0_8_ = 0x7fffffff7fffffff;
              auVar64._12_4_ = 0x7fffffff;
              auVar39 = vandps_avx(local_868,auVar64);
              auVar65._0_4_ = auVar39._0_4_ * 1.1920929e-07;
              auVar65._4_4_ = auVar39._4_4_ * 1.1920929e-07;
              auVar65._8_4_ = auVar39._8_4_ * 1.1920929e-07;
              auVar65._12_4_ = auVar39._12_4_ * 1.1920929e-07;
              uVar29 = CONCAT44(auVar65._4_4_,auVar65._0_4_);
              auVar79._0_8_ = uVar29 ^ 0x8000000080000000;
              auVar79._8_4_ = -auVar65._8_4_;
              auVar79._12_4_ = -auVar65._12_4_;
              auVar74 = vcmpps_avx(auVar74,auVar79,5);
              auVar125 = vmaxps_avx(local_ab8,local_878);
              auVar125 = vmaxps_avx(auVar125,auVar43);
              auVar125 = vcmpps_avx(auVar125,auVar65,2);
              auVar74 = vorps_avx(auVar74,auVar125);
              mapUV = (UVIdentity<4>)0x0;
              local_858 = &mapUV;
              auVar125 = auVar22 & auVar74;
              if ((((auVar125 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar125 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar125 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar125[0xf] < '\0') {
                auVar44._0_4_ = fVar102 * fVar71;
                auVar44._4_4_ = fVar106 * fVar47;
                auVar44._8_4_ = fVar117 * fVar48;
                auVar44._12_4_ = fVar133 * fVar49;
                auVar55._0_4_ = fVar164 * fVar148;
                auVar55._4_4_ = fVar165 * fVar149;
                auVar55._8_4_ = fVar166 * fVar150;
                auVar55._12_4_ = fVar167 * fVar151;
                auVar38 = vsubps_avx(auVar55,auVar44);
                auVar66._0_4_ = fVar148 * fVar134;
                auVar66._4_4_ = fVar149 * fVar140;
                auVar66._8_4_ = fVar150 * fVar142;
                auVar66._12_4_ = fVar151 * fVar144;
                auVar80._0_4_ = fVar102 * fVar90;
                auVar80._4_4_ = fVar106 * fVar100;
                auVar80._8_4_ = fVar117 * fVar103;
                auVar80._12_4_ = fVar133 * fVar105;
                auVar40 = vsubps_avx(auVar80,auVar66);
                auVar152._8_4_ = 0x7fffffff;
                auVar152._0_8_ = 0x7fffffff7fffffff;
                auVar152._12_4_ = 0x7fffffff;
                auVar125 = vandps_avx(auVar152,auVar44);
                auVar126 = vandps_avx(auVar152,auVar66);
                auVar125 = vcmpps_avx(auVar125,auVar126,1);
                local_808 = vblendvps_avx(auVar40,auVar38,auVar125);
                auVar56._0_4_ = fVar153 * fVar90;
                auVar56._4_4_ = fVar155 * fVar100;
                auVar56._8_4_ = fVar156 * fVar103;
                auVar56._12_4_ = fVar157 * fVar105;
                auVar67._0_4_ = fVar153 * fVar71;
                auVar67._4_4_ = fVar155 * fVar47;
                auVar67._8_4_ = fVar156 * fVar48;
                auVar67._12_4_ = fVar157 * fVar49;
                auVar81._0_4_ = fVar148 * fVar158;
                auVar81._4_4_ = fVar149 * fVar161;
                auVar81._8_4_ = fVar150 * fVar162;
                auVar81._12_4_ = fVar151 * fVar163;
                auVar38 = vsubps_avx(auVar67,auVar81);
                auVar122._0_4_ = fVar148 * fVar107;
                auVar122._4_4_ = fVar149 * fVar104;
                auVar122._8_4_ = fVar150 * fVar116;
                auVar122._12_4_ = fVar151 * fVar119;
                auVar40 = vsubps_avx(auVar122,auVar56);
                auVar125 = vandps_avx(auVar152,auVar81);
                auVar126 = vandps_avx(auVar152,auVar56);
                auVar125 = vcmpps_avx(auVar125,auVar126,1);
                local_7f8 = vblendvps_avx(auVar40,auVar38,auVar125);
                auVar68._0_4_ = fVar102 * fVar107;
                auVar68._4_4_ = fVar106 * fVar104;
                auVar68._8_4_ = fVar117 * fVar116;
                auVar68._12_4_ = fVar133 * fVar119;
                auVar82._0_4_ = fVar102 * fVar158;
                auVar82._4_4_ = fVar106 * fVar161;
                auVar82._8_4_ = fVar117 * fVar162;
                auVar82._12_4_ = fVar133 * fVar163;
                auVar114._0_4_ = fVar164 * fVar153;
                auVar114._4_4_ = fVar165 * fVar155;
                auVar114._8_4_ = fVar166 * fVar156;
                auVar114._12_4_ = fVar167 * fVar157;
                auVar123._0_4_ = fVar153 * fVar134;
                auVar123._4_4_ = fVar155 * fVar140;
                auVar123._8_4_ = fVar156 * fVar142;
                auVar123._12_4_ = fVar157 * fVar144;
                auVar38 = vsubps_avx(auVar82,auVar114);
                auVar40 = vsubps_avx(auVar123,auVar68);
                auVar125 = vandps_avx(auVar152,auVar114);
                auVar126 = vandps_avx(auVar152,auVar68);
                auVar125 = vcmpps_avx(auVar125,auVar126,1);
                local_7e8 = vblendvps_avx(auVar40,auVar38,auVar125);
                fVar71 = fVar99 * local_808._0_4_ +
                         local_7f8._0_4_ * local_aa8._4_4_ + local_7e8._0_4_ * fVar89;
                fVar102 = fVar99 * local_808._4_4_ +
                          local_7f8._4_4_ * local_aa8._4_4_ + local_7e8._4_4_ * fVar89;
                fVar104 = fVar99 * local_808._8_4_ +
                          local_7f8._8_4_ * local_aa8._4_4_ + local_7e8._8_4_ * fVar89;
                fVar89 = fVar99 * local_808._12_4_ +
                         local_7f8._12_4_ * local_aa8._4_4_ + local_7e8._12_4_ * fVar89;
                auVar115._0_4_ = fVar71 + fVar71;
                auVar115._4_4_ = fVar102 + fVar102;
                auVar115._8_4_ = fVar104 + fVar104;
                auVar115._12_4_ = fVar89 + fVar89;
                fVar72 = local_808._0_4_ * fVar72 +
                         local_7f8._0_4_ * fVar98 + local_7e8._0_4_ * fVar101;
                fVar84 = local_808._4_4_ * fVar88 +
                         local_7f8._4_4_ * fVar84 + local_7e8._4_4_ * fVar86;
                fVar86 = local_808._8_4_ * fVar15 +
                         local_7f8._8_4_ * fVar13 + local_7e8._8_4_ * fVar14;
                fVar88 = local_808._12_4_ * fVar18 +
                         local_7f8._12_4_ * fVar16 + local_7e8._12_4_ * fVar17;
                auVar125 = vrcpps_avx(auVar115);
                fVar89 = auVar125._0_4_;
                auVar130._0_4_ = auVar115._0_4_ * fVar89;
                fVar99 = auVar125._4_4_;
                auVar130._4_4_ = auVar115._4_4_ * fVar99;
                fVar98 = auVar125._8_4_;
                auVar130._8_4_ = auVar115._8_4_ * fVar98;
                fVar101 = auVar125._12_4_;
                auVar130._12_4_ = auVar115._12_4_ * fVar101;
                auVar138._8_4_ = 0x3f800000;
                auVar138._0_8_ = &DAT_3f8000003f800000;
                auVar138._12_4_ = 0x3f800000;
                auVar125 = vsubps_avx(auVar138,auVar130);
                local_818._0_4_ = (fVar72 + fVar72) * (fVar89 + fVar89 * auVar125._0_4_);
                local_818._4_4_ = (fVar84 + fVar84) * (fVar99 + fVar99 * auVar125._4_4_);
                local_818._8_4_ = (fVar86 + fVar86) * (fVar98 + fVar98 * auVar125._8_4_);
                local_818._12_4_ = (fVar88 + fVar88) * (fVar101 + fVar101 * auVar125._12_4_);
                uVar23 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
                auVar124._4_4_ = uVar23;
                auVar124._0_4_ = uVar23;
                auVar124._8_4_ = uVar23;
                auVar124._12_4_ = uVar23;
                auVar125 = vcmpps_avx(auVar124,local_818,2);
                fVar89 = ray->tfar;
                auVar131._4_4_ = fVar89;
                auVar131._0_4_ = fVar89;
                auVar131._8_4_ = fVar89;
                auVar131._12_4_ = fVar89;
                auVar126 = vcmpps_avx(local_818,auVar131,2);
                auVar125 = vandps_avx(auVar125,auVar126);
                auVar132 = ZEXT1664(local_a68);
                auVar126 = vcmpps_avx(auVar115,_DAT_01feba10,4);
                auVar125 = vandps_avx(auVar126,auVar125);
                auVar74 = vandps_avx(auVar74,auVar22);
                auVar125 = vpslld_avx(auVar125,0x1f);
                auVar126 = vpsrad_avx(auVar125,0x1f);
                auVar125 = auVar74 & auVar126;
                if ((((auVar125 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar125 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar125 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar125[0xf] < '\0') {
                  local_848 = vandps_avx(auVar126,auVar74);
                  local_888 = local_ab8;
                  auVar74 = vrcpps_avx(local_868);
                  fVar89 = auVar74._0_4_;
                  auVar57._0_4_ = local_868._0_4_ * fVar89;
                  fVar99 = auVar74._4_4_;
                  auVar57._4_4_ = local_868._4_4_ * fVar99;
                  fVar98 = auVar74._8_4_;
                  auVar57._8_4_ = local_868._8_4_ * fVar98;
                  fVar101 = auVar74._12_4_;
                  auVar57._12_4_ = local_868._12_4_ * fVar101;
                  auVar69._8_4_ = 0x3f800000;
                  auVar69._0_8_ = &DAT_3f8000003f800000;
                  auVar69._12_4_ = 0x3f800000;
                  auVar74 = vsubps_avx(auVar69,auVar57);
                  auVar45._0_4_ = fVar89 + fVar89 * auVar74._0_4_;
                  auVar45._4_4_ = fVar99 + fVar99 * auVar74._4_4_;
                  auVar45._8_4_ = fVar98 + fVar98 * auVar74._8_4_;
                  auVar45._12_4_ = fVar101 + fVar101 * auVar74._12_4_;
                  auVar58._8_4_ = 0x219392ef;
                  auVar58._0_8_ = 0x219392ef219392ef;
                  auVar58._12_4_ = 0x219392ef;
                  auVar39 = vcmpps_avx(auVar39,auVar58,5);
                  auVar39 = vandps_avx(auVar39,auVar45);
                  auVar59._0_4_ = local_ab8._0_4_ * auVar39._0_4_;
                  auVar59._4_4_ = local_ab8._4_4_ * auVar39._4_4_;
                  auVar59._8_4_ = local_ab8._8_4_ * auVar39._8_4_;
                  auVar59._12_4_ = local_ab8._12_4_ * auVar39._12_4_;
                  local_838 = vminps_avx(auVar59,auVar69);
                  auVar46._0_4_ = local_878._0_4_ * auVar39._0_4_;
                  auVar46._4_4_ = local_878._4_4_ * auVar39._4_4_;
                  auVar46._8_4_ = local_878._8_4_ * auVar39._8_4_;
                  auVar46._12_4_ = local_878._12_4_ * auVar39._12_4_;
                  local_828 = vminps_avx(auVar46,auVar69);
                  uVar23 = vmovmskps_avx(local_848);
                  uVar35 = CONCAT44((int)(uVar35 >> 0x20),uVar23);
                  do {
                    uVar29 = 0;
                    if (uVar35 != 0) {
                      for (; (uVar35 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                      }
                    }
                    h.geomID = *(uint *)((long)&local_898 + uVar29 * 4);
                    pGVar11 = (pSVar5->geometries).items[h.geomID].ptr;
                    if ((pGVar11->mask & ray->mask) == 0) {
                      uVar35 = uVar35 ^ 1L << (uVar29 & 0x3f);
                      bVar21 = true;
                    }
                    else {
                      pRVar12 = context->args;
                      if ((pRVar12->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar21 = false;
                      }
                      else {
                        h.u = *(float *)(local_838 + uVar29 * 4);
                        h.v = *(float *)(local_828 + uVar29 * 4);
                        args.context = context->user;
                        h.primID = *(uint *)((long)&local_8a8 + uVar29 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar29 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar29 * 4);
                        h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar29 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        fVar89 = ray->tfar;
                        ray->tfar = *(float *)(local_818 + uVar29 * 4);
                        local_abc = -1;
                        args.valid = &local_abc;
                        args.geometryUserPtr = pGVar11->userPtr;
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if (pGVar11->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002e4f95:
                          if (pRVar12->filter != (RTCFilterFunctionN)0x0) {
                            if (((pRVar12->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar11->field_8).field_0x2 & 0x40) != 0)) {
                              (*pRVar12->filter)(&args);
                              auVar132 = ZEXT1664(local_a68);
                            }
                            if (*args.valid == 0) goto LAB_002e4feb;
                          }
                          bVar21 = false;
                        }
                        else {
                          local_aa8 = context;
                          local_ab8._0_8_ = ray;
                          (*pGVar11->occlusionFilterN)(&args);
                          auVar132 = ZEXT1664(local_a68);
                          ray = (Ray *)local_ab8._0_8_;
                          context = local_aa8;
                          if (*args.valid != 0) goto LAB_002e4f95;
LAB_002e4feb:
                          ray->tfar = fVar89;
                          uVar35 = uVar35 ^ 1L << (uVar29 & 0x3f);
                          bVar21 = true;
                        }
                      }
                    }
                    iVar36 = 0;
                    if (!bVar21) {
                      uVar29 = local_a80;
                      uVar30 = local_a70;
                      uVar31 = local_a78;
                      uVar33 = local_a88;
                      if (bVar37) {
                        ray->tfar = -INFINITY;
                        iVar36 = 3;
                      }
                      goto LAB_002e5072;
                    }
                  } while (uVar35 != 0);
                  uVar35 = 0;
                }
              }
              iVar36 = 0;
              local_a50 = local_a50 + 1;
              bVar37 = local_a50 < local_a58;
              uVar29 = local_a80;
              uVar30 = local_a70;
              uVar31 = local_a78;
              uVar33 = local_a88;
            } while (local_a50 != local_a58);
          }
        }
LAB_002e5072:
        uVar35 = uVar33;
      } while (iVar36 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }